

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_NewInnerStackScFunc<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint index;
  uint localRegisterID;
  FrameDisplay *environment;
  FunctionInfoPtrPtr infoRef;
  StackScriptFunction *stackFunction;
  ScriptFunction *value;
  
  environment = *(FrameDisplay **)(this + (ulong)playout->Instance * 8 + 0x160);
  index = playout->SlotIndex;
  localRegisterID = playout->Value;
  infoRef = ParseableFunctionInfo::GetNestedFuncReference
                      (*(ParseableFunctionInfo **)(this + 0x88),index);
  stackFunction = GetStackNestedFunction(this,index);
  value = StackScriptFunction::OP_NewStackScFunc
                    (environment,infoRef,&stackFunction->super_ScriptFunction);
  SetRegAllowStackVarEnableOnly<unsigned_int>(this,localRegisterID,value);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewInnerStackScFunc(const unaligned T * playout)
    {
        uint funcIndex = playout->SlotIndex;
        FrameDisplay *frameDisplay = (FrameDisplay*)GetNonVarReg(playout->Instance);
        SetRegAllowStackVarEnableOnly(playout->Value,
            StackScriptFunction::OP_NewStackScFunc(frameDisplay,
                this->m_functionBody->GetNestedFuncReference(funcIndex),
                this->GetStackNestedFunction(funcIndex)));
    }